

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_free_hash_table.h
# Opt level: O0

pair<const_unsigned_long,_unsigned_long> __thiscall
neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Get
          (LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL> *this
          ,unsigned_long *key)

{
  Locator LVar1;
  size_t sVar2;
  out_of_range *this_00;
  DataNode *dataNode;
  hash<unsigned_long> local_31;
  Locator local_30;
  Locator locator;
  unsigned_long *key_local;
  LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL> *this_local;
  pair<const_unsigned_long,_unsigned_long> ret;
  
  locator.pos = (Node *)key;
  epoch::
  MemoryEpoch<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>,_neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
  ::EnterEpoch(&this->epoch_);
  LVar1.pos = locator.pos;
  sVar2 = std::hash<unsigned_long>::operator()(&local_31,(unsigned_long)(locator.pos)->_vptr_Node);
  Locator::Locator(&local_30,this,LVar1.pos,sVar2);
  if (local_30.pos == (Node *)0x0) {
    epoch::
    MemoryEpoch<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>,_neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
    ::EnterEpoch(&this->epoch_);
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"No element found");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  std::pair<const_unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
            ((pair<const_unsigned_long,_unsigned_long> *)&this_local,
             (unsigned_long *)(local_30.pos + 1),(unsigned_long *)&local_30.pos[1].type);
  epoch::
  MemoryEpoch<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>,_neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
  ::LeaveEpoch(&this->epoch_);
  return _this_local;
}

Assistant:

inline std::pair<const Key, T> Get(const Key &key) {
        epoch_.EnterEpoch();
        Locator locator(*this, key, Hash()(key), get_type());
        if (locator.pos == nullptr) {
            epoch_.EnterEpoch();
            throw std::out_of_range("No element found");
        }
        DataNode *dataNode = static_cast<DataNode *>(locator.pos);
        std::pair<const Key, T> ret{dataNode->data.key, dataNode->data.mapped};
        epoch_.LeaveEpoch();
        return ret;
    }